

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledImage.cpp
# Opt level: O3

void __thiscall
Rml::DecoratorTiledImageInstancer::~DecoratorTiledImageInstancer(DecoratorTiledImageInstancer *this)

{
  ~DecoratorTiledImageInstancer(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

DecoratorTiledImageInstancer::~DecoratorTiledImageInstancer() {}